

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings(SimpleSerialAnalyzerSettings *this)

{
  uint uVar1;
  SimpleSerialAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleSerialAnalyzerSettings_0010ad68;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mInputChannelInterface);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mInputChannelInterface,"Serial");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mInputChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mBitRateInterface,"Bit Rate (Bits/S)")
  ;
  uVar1 = (uint)this;
  AnalyzerSettingInterfaceInteger::SetMax(uVar1 + 0x40);
  AnalyzerSettingInterfaceInteger::SetMin(uVar1 + 0x40);
  AnalyzerSettingInterfaceInteger::SetInteger(uVar1 + 0x40);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption(uVar1,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar1,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar1,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings()
:	mInputChannel( UNDEFINED_CHANNEL ),
	mBitRate( 9600 ),
	mInputChannelInterface(),
	mBitRateInterface()
{
	mInputChannelInterface.SetTitleAndTooltip( "Serial", "Standard Simple Serial" );
	mInputChannelInterface.SetChannel( mInputChannel );

	mBitRateInterface.SetTitleAndTooltip( "Bit Rate (Bits/S)",  "Specify the bit rate in bits per second." );
	mBitRateInterface.SetMax( 6000000 );
	mBitRateInterface.SetMin( 1 );
	mBitRateInterface.SetInteger( mBitRate );

	AddInterface( &mInputChannelInterface );
	AddInterface( &mBitRateInterface );

	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	AddChannel( mInputChannel, "Serial", false );
}